

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.c
# Opt level: O2

strbuilder * format_entry(stumpless_entry_conflict *entry,stumpless_target *target)

{
  size_t size;
  strbuilder *psVar1;
  char timestamp [33];
  
  size = gmtime_r_get_now(timestamp);
  lock_entry((stumpless_entry *)entry);
  psVar1 = strbuilder_new();
  psVar1 = strbuilder_append_char(psVar1,'<');
  psVar1 = strbuilder_append_positive_int(psVar1,entry->prival);
  psVar1 = strbuilder_append_string(psVar1,">1 ");
  psVar1 = strbuilder_append_buffer(psVar1,timestamp,size);
  psVar1 = strbuilder_append_char(psVar1,' ');
  if (entry->hostname_length == 0) {
    psVar1 = strbuilder_append_hostname(psVar1);
  }
  else {
    psVar1 = strbuilder_append_buffer(psVar1,entry->hostname,entry->hostname_length);
  }
  psVar1 = strbuilder_append_char(psVar1,' ');
  psVar1 = strbuilder_append_app_name(psVar1,(stumpless_entry *)entry);
  psVar1 = strbuilder_append_char(psVar1,' ');
  if ((target->options & 1) == 0) {
    psVar1 = strbuilder_append_char(psVar1,'-');
  }
  else if (entry->procid_length == 0) {
    psVar1 = strbuilder_append_procid(psVar1);
  }
  else {
    psVar1 = strbuilder_append_buffer(psVar1,entry->procid,entry->procid_length);
  }
  psVar1 = strbuilder_append_char(psVar1,' ');
  psVar1 = strbuilder_append_msgid(psVar1,(stumpless_entry *)entry);
  psVar1 = strbuilder_append_char(psVar1,' ');
  psVar1 = strbuilder_append_structured_data(psVar1,(stumpless_entry *)entry);
  if (entry->message_length != 0) {
    psVar1 = strbuilder_append_char(psVar1,' ');
    psVar1 = strbuilder_append_message(psVar1,(stumpless_entry *)entry);
  }
  psVar1 = strbuilder_append_char(psVar1,'\n');
  unlock_entry((stumpless_entry *)entry);
  return psVar1;
}

Assistant:

struct strbuilder *
format_entry( const struct stumpless_entry *entry,
              const struct stumpless_target *target ) {
  char timestamp[RFC_5424_TIMESTAMP_BUFFER_SIZE];
  struct strbuilder *builder;
  size_t timestamp_size;

  // do this as soon as possible to be closer to invocation
  timestamp_size = config_get_now( timestamp );

  lock_entry( entry );

  builder = strbuilder_new(  );
  builder = strbuilder_append_char( builder, '<' );
  builder = strbuilder_append_positive_int( builder, entry->prival );
  builder = strbuilder_append_string( builder, ">1 " );
  builder = strbuilder_append_buffer( builder, timestamp, timestamp_size );
  builder = strbuilder_append_char( builder, ' ' );

  if( entry->hostname_length > 0 ) {
    builder = strbuilder_append_buffer( builder,
                                        entry->hostname,
                                        entry->hostname_length );
  } else {
    builder = strbuilder_append_hostname( builder );
  }

  builder = strbuilder_append_char( builder, ' ' );
  builder = strbuilder_append_app_name( builder, entry );
  builder = strbuilder_append_char( builder, ' ' );
  if( target->options & STUMPLESS_OPTION_PID ) {
    if( entry->procid_length > 0 ) {
      builder = strbuilder_append_buffer( builder,
                                          entry->procid,
                                          entry->procid_length );
    } else {
      builder = strbuilder_append_procid( builder );
    }
  } else {
    builder = strbuilder_append_char( builder, RFC_5424_NILVALUE );
  }
  builder = strbuilder_append_char( builder, ' ' );
  builder = strbuilder_append_msgid( builder, entry );
  builder = strbuilder_append_char( builder, ' ' );
  builder = strbuilder_append_structured_data( builder, entry );

  if( entry->message_length > 0 ) {
    builder = strbuilder_append_char( builder, ' ' );
    builder = strbuilder_append_message( builder, entry );
  }

  builder = strbuilder_append_char( builder, '\n' );

  unlock_entry( entry );

  return builder;
}